

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundogroup.cpp
# Opt level: O3

void __thiscall QUndoGroup::addStack(QUndoGroup *this,QUndoStack *stack)

{
  long lVar1;
  long *plVar2;
  long i;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  QUndoStack *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&this->field_0x8;
  i = *(long *)(lVar3 + 0x90);
  if (i != 0) {
    lVar4 = 0;
    do {
      if (i * 8 - lVar4 == 0) goto LAB_0060611f;
      lVar1 = lVar4 + 8;
      plVar2 = (long *)(*(long *)(lVar3 + 0x88) + lVar4);
      lVar4 = lVar1;
    } while ((QUndoStack *)*plVar2 != stack);
    if (lVar1 != 0) goto LAB_0060615c;
  }
LAB_0060611f:
  local_28 = stack;
  QtPrivate::QPodArrayOps<QUndoStack*>::emplace<QUndoStack*&>
            ((QPodArrayOps<QUndoStack*> *)(lVar3 + 0x80),i,&local_28);
  QList<QUndoStack_*>::end((QList<QUndoStack_*> *)(lVar3 + 0x80));
  lVar3 = *(long *)&stack->field_0x8;
  if (*(QUndoGroup **)(lVar3 + 0xb0) != (QUndoGroup *)0x0) {
    removeStack(*(QUndoGroup **)(lVar3 + 0xb0),stack);
    lVar3 = *(long *)&stack->field_0x8;
  }
  *(QUndoGroup **)(lVar3 + 0xb0) = this;
LAB_0060615c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUndoGroup::addStack(QUndoStack *stack)
{
    Q_D(QUndoGroup);

    if (d->stack_list.contains(stack))
        return;
    d->stack_list.append(stack);

    if (QUndoGroup *other = stack->d_func()->group)
        other->removeStack(stack);
    stack->d_func()->group = this;
}